

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_sigalgs_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined1 local_38 [8];
  CBS supported_signature_algorithms;
  CBS *contents_local;
  uint8_t *out_alert_local;
  SSL_HANDSHAKE *hs_local;
  
  supported_signature_algorithms.len = (size_t)contents;
  Array<unsigned_short>::Reset(&hs->peer_sigalgs);
  if (supported_signature_algorithms.len == 0) {
    hs_local._7_1_ = true;
  }
  else {
    iVar2 = CBS_get_u16_length_prefixed((CBS *)supported_signature_algorithms.len,(CBS *)local_38);
    if (((iVar2 != 0) && (sVar3 = CBS_len((CBS *)supported_signature_algorithms.len), sVar3 == 0))
       && (bVar1 = tls1_parse_peer_sigalgs(hs,(CBS *)local_38), bVar1)) {
      return true;
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_sigalgs_parse_clienthello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                          CBS *contents) {
  hs->peer_sigalgs.Reset();
  if (contents == NULL) {
    return true;
  }

  CBS supported_signature_algorithms;
  if (!CBS_get_u16_length_prefixed(contents, &supported_signature_algorithms) ||
      CBS_len(contents) != 0 ||
      !tls1_parse_peer_sigalgs(hs, &supported_signature_algorithms)) {
    return false;
  }

  return true;
}